

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O0

bool __thiscall
iDynTree::SensorsList::removeSensor
          (SensorsList *this,SensorType *sensor_type,ptrdiff_t sensor_index)

{
  ulong uVar1;
  size_type sVar2;
  reference ppSVar3;
  size_type sVar4;
  size_type in_RDX;
  uint *in_RSI;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_bool>
  pVar5;
  size_t index;
  SensorNameToIndexMap *nameToIndex;
  Sensor *s;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *typeVector;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *in_stack_fffffffffffffee8;
  __normal_iterator<iDynTree::Sensor_*const_*,_std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>
  *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  in_stack_ffffffffffffff00;
  const_iterator in_stack_ffffffffffffff08;
  string local_a8 [72];
  ulong local_60;
  reference local_58;
  Sensor **local_50;
  Sensor **local_48;
  Sensor **local_40;
  value_type local_30;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *local_28;
  size_type local_20;
  uint *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = std::
             vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
             ::operator[](*(vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
                            **)(in_RDI + 8),(ulong)*in_RSI);
  sVar4 = local_20;
  sVar2 = std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::size(local_28);
  if ((long)sVar4 < (long)sVar2) {
    ppSVar3 = std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::operator[]
                        (local_28,local_20);
    local_30 = *ppSVar3;
    local_48 = (Sensor **)
               std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::begin
                         (in_stack_fffffffffffffee8);
    local_40 = (Sensor **)
               __gnu_cxx::
               __normal_iterator<iDynTree::Sensor_**,_std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>
               ::operator+((__normal_iterator<iDynTree::Sensor_**,_std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>
                            *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                           (difference_type)in_stack_fffffffffffffef0);
    __gnu_cxx::
    __normal_iterator<iDynTree::Sensor*const*,std::vector<iDynTree::Sensor*,std::allocator<iDynTree::Sensor*>>>
    ::__normal_iterator<iDynTree::Sensor**>
              (in_stack_fffffffffffffef0,
               (__normal_iterator<iDynTree::Sensor_**,_std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>
                *)in_stack_fffffffffffffee8);
    local_50 = (Sensor **)
               std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::erase
                         ((vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *)
                          in_stack_ffffffffffffff00._M_node,in_stack_ffffffffffffff08);
    local_58 = std::
               vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
               ::operator[]((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_>_>
                             *)(*(long *)(in_RDI + 8) + 0x18),(ulong)*local_18);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             *)0x475921);
    local_60 = 0;
    while( true ) {
      uVar1 = local_60;
      sVar4 = std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::size(local_28);
      if (sVar4 <= uVar1) break;
      ppSVar3 = std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::operator[]
                          (local_28,local_60);
      (*(*ppSVar3)->_vptr_Sensor[2])();
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_&,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
                  *)in_stack_ffffffffffffff00._M_node,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                 (unsigned_long *)in_stack_fffffffffffffef0);
      pVar5 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
              ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                        *)in_stack_ffffffffffffff00._M_node,
                       (value_type *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      in_stack_ffffffffffffff00 = pVar5.first._M_node;
      in_stack_fffffffffffffeff = pVar5.second;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
               *)0x4759e8);
      std::__cxx11::string::~string(local_a8);
      local_60 = local_60 + 1;
    }
    if (local_30 != (value_type)0x0) {
      (*local_30->_vptr_Sensor[1])();
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SensorsList::removeSensor(const SensorType & sensor_type, const std::ptrdiff_t sensor_index)
    {
        std::vector<Sensor*>& typeVector = this->pimpl->allSensors[sensor_type];
        if (sensor_index >= static_cast<std::ptrdiff_t>(typeVector.size())) {
            return false;
        }
        Sensor *s = typeVector[sensor_index];
        typeVector.erase(typeVector.begin() + sensor_index);
        SensorsListPimpl::SensorNameToIndexMap& nameToIndex = this->pimpl->sensorsNameToIndex[sensor_type];
        // We have to rebuild the name->index map as indices have changed
        nameToIndex.clear();
        for (size_t index = 0; index < typeVector.size(); ++index) {
            nameToIndex.insert(SensorsListPimpl::SensorNameToIndexMap::value_type(typeVector[index]->getName(), index));
        }

        delete s;
        return true;
    }